

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

RequestBuilder * __thiscall
restincurl::RequestBuilder::StoreData<std::__cxx11::string>
          (RequestBuilder *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  _Head_base<0UL,_restincurl::Request_*,_false> _Var1;
  __uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
  _Var2;
  unique_ptr<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_> this_00
  ;
  RequestBuilder *pRVar3;
  
  if (this->is_built_ != true) {
    this_00._M_t.
    super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
    .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>,_true,_true>
          )operator_new(0x10);
    InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::InDataHandler((InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00._M_t.
                       super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
                       .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl,
                    data);
    _Var1._M_head_impl =
         (this->request_)._M_t.
         super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
         super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
         super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
    _Var2._M_t.
    super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
    .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl =
         *(tuple<restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_> *
          )&((_Var1._M_head_impl)->default_in_handler_)._M_t;
    ((_Var1._M_head_impl)->default_in_handler_)._M_t =
         this_00._M_t.
         super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
         .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
         )_Var2._M_t.
          super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
          .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
         )0x0) {
      (**(code **)(*(long *)_Var2._M_t.
                            super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
                            .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>.
                            _M_head_impl + 8))();
    }
    pRVar3 = StoreData<std::__cxx11::string>
                       (this,(InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)this_00._M_t.
                                super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
                                .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>.
                                _M_head_impl);
    return pRVar3;
  }
  __assert_fail("!is_built_",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x5c4,
                "RequestBuilder &restincurl::RequestBuilder::StoreData(T &) [T = std::basic_string<char>]"
               );
}

Assistant:

RequestBuilder& StoreData(T& data) {
            assert(!is_built_);
            auto handler = std::make_unique<InDataHandler<T>>(data);
            auto& handler_ref = *handler;
            request_->SetDefaultInHandler(std::move(handler));
            return StoreData(handler_ref);
        }